

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O1

void __thiscall TcpSocketTest::handleData(TcpSocketTest *this)

{
  Socket *in_RSI;
  
  handleData((TcpSocketTest *)&this[-1].super_TestCase.mTestName._M_string_length,in_RSI);
  return;
}

Assistant:

void TcpSocketTest::handleData( Socket *s )
{
	LOG_NOTICE( "called" );
	uint32_t num;
	
	int res = s->read( &num, 4 );
	
	if ( res != 4 )
		TestFailed( "Read Failed %d", res );

	num += 1;
	res = s->write( &num, 4 );

	if ( res != 4 )
		TestFailed( "Write Failed %d", res );
}